

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

InputVertexId __thiscall S2Builder::AddVertex(S2Builder *this,S2Point *v)

{
  bool bVar1;
  reference b;
  size_type sVar2;
  S2Point *v_local;
  S2Builder *this_local;
  
  bVar1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::empty
                    (&this->input_vertices_);
  if (!bVar1) {
    b = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::back
                  (&this->input_vertices_);
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                      ((BasicVector<Vector3,_double,_3UL> *)v,b);
    if (!bVar1) goto LAB_003cbe6d;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
            (&this->input_vertices_,v);
LAB_003cbe6d:
  sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                    (&this->input_vertices_);
  return (int)sVar2 + -1;
}

Assistant:

S2Builder::InputVertexId S2Builder::AddVertex(const S2Point& v) {
  // Remove duplicate vertices that follow the pattern AB, BC, CD.  If we want
  // to do anything more sophisticated, either use a ValueLexicon, or sort the
  // vertices once they have all been added, remove duplicates, and update the
  // edges.
  if (input_vertices_.empty() || v != input_vertices_.back()) {
    input_vertices_.push_back(v);
  }
  return input_vertices_.size() - 1;
}